

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_user_resp(Curl_easy *data,int ftpcode,ftpstate instate)

{
  connectdata *pcVar1;
  anon_union_248_5_a113b5f6_for_proto *pp;
  char *local_48;
  ftp_conn *ftpc;
  connectdata *conn;
  CURLcode result;
  ftpstate instate_local;
  int ftpcode_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  pp = &pcVar1->proto;
  if ((ftpcode == 0x14b) && ((pcVar1->proto).ftpc.state == FTP_USER)) {
    if (pcVar1->passwd == (char *)0x0) {
      local_48 = "";
    }
    else {
      local_48 = pcVar1->passwd;
    }
    conn._4_4_ = Curl_pp_sendf(data,&(pp->ftpc).pp,"PASS %s",local_48);
    if (conn._4_4_ == CURLE_OK) {
      _state(data,FTP_PASS);
    }
  }
  else if (ftpcode / 100 == 2) {
    conn._4_4_ = ftp_state_loggedin(data);
  }
  else if (ftpcode == 0x14c) {
    if ((data->set).str[10] == (char *)0x0) {
      Curl_failf(data,"ACCT requested but none available",(long)ftpcode % 100 & 0xffffffff);
      conn._4_4_ = CURLE_LOGIN_DENIED;
    }
    else {
      conn._4_4_ = Curl_pp_sendf(data,&(pp->ftpc).pp,"ACCT %s",(data->set).str[10]);
      if (conn._4_4_ == CURLE_OK) {
        _state(data,FTP_ACCT);
      }
    }
  }
  else if (((data->set).str[0xb] == (char *)0x0) ||
          ((*(byte *)((long)&pcVar1->proto + 0xf0) & 1) != 0)) {
    Curl_failf(data,"Access denied: %03d",(ulong)(uint)ftpcode);
    conn._4_4_ = CURLE_LOGIN_DENIED;
  }
  else {
    conn._4_4_ = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s",(data->set).str[0xb]);
    if (conn._4_4_ == CURLE_OK) {
      *(byte *)((long)&pcVar1->proto + 0xf0) = *(byte *)((long)&pcVar1->proto + 0xf0) & 0xfe | 1;
      _state(data,FTP_USER);
    }
  }
  return conn._4_4_;
}

Assistant:

static CURLcode ftp_state_user_resp(struct Curl_easy *data,
                                    int ftpcode,
                                    ftpstate instate)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  (void)instate; /* no use for this yet */

  /* some need password anyway, and others just return 2xx ignored */
  if((ftpcode == 331) && (ftpc->state == FTP_USER)) {
    /* 331 Password required for ...
       (the server requires to send the user's password too) */
    result = Curl_pp_sendf(data, &ftpc->pp, "PASS %s",
                           conn->passwd?conn->passwd:"");
    if(!result)
      state(data, FTP_PASS);
  }
  else if(ftpcode/100 == 2) {
    /* 230 User ... logged in.
       (the user logged in with or without password) */
    result = ftp_state_loggedin(data);
  }
  else if(ftpcode == 332) {
    if(data->set.str[STRING_FTP_ACCOUNT]) {
      result = Curl_pp_sendf(data, &ftpc->pp, "ACCT %s",
                             data->set.str[STRING_FTP_ACCOUNT]);
      if(!result)
        state(data, FTP_ACCT);
    }
    else {
      failf(data, "ACCT requested but none available");
      result = CURLE_LOGIN_DENIED;
    }
  }
  else {
    /* All other response codes, like:

    530 User ... access denied
    (the server denies to log the specified user) */

    if(data->set.str[STRING_FTP_ALTERNATIVE_TO_USER] &&
       !ftpc->ftp_trying_alternative) {
      /* Ok, USER failed.  Let's try the supplied command. */
      result =
        Curl_pp_sendf(data, &ftpc->pp, "%s",
                      data->set.str[STRING_FTP_ALTERNATIVE_TO_USER]);
      if(!result) {
        ftpc->ftp_trying_alternative = TRUE;
        state(data, FTP_USER);
      }
    }
    else {
      failf(data, "Access denied: %03d", ftpcode);
      result = CURLE_LOGIN_DENIED;
    }
  }
  return result;
}